

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall llbuild::ninja::Lexer::lexVariableString(Lexer *this,Token *result)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)this->bufferPos;
  if (pbVar2 != (byte *)((this->buffer).Data + (this->buffer).Length)) {
    do {
      bVar1 = *pbVar2;
      if (bVar1 < 0x24) {
        if ((bVar1 == 10) || (bVar1 == 0xd)) break;
      }
      else if (bVar1 == 0x24) {
        getNextChar(this);
      }
      else if (bVar1 == 0xff) break;
      getNextChar(this);
      pbVar2 = (byte *)this->bufferPos;
    } while (pbVar2 != (byte *)((this->buffer).Data + (this->buffer).Length));
  }
  result->tokenKind = String;
  result->length = (int)pbVar2 - *(int *)&result->start;
  return result;
}

Assistant:

Token& Lexer::lexVariableString(Token& result) {
  // String tokens in variable assignments consume until the end of the line.
  while (true) {
    int c = peekNextChar();

    // If this is an escape character, skip the next character.
    if (c == '$') {
      getNextChar(); // Consume the actual '$'.
      getNextChar(); // Consume the next character.
      continue;
    }

    // Otherwise, continue only if this is not the EOL or EOF.
    if (c == '\n' || c == -1 || c == '\r')
      break;

    getNextChar();
  }

  return setTokenKind(result, Token::Kind::String);
}